

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPack.c
# Opt level: O0

Vec_Int_t * Gia_ManLutCollect2(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  bool bVar6;
  int iFan;
  int Id;
  int k;
  int i;
  Vec_Int_t *vOrder;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManLutNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  Gia_ManIncrementTravId(p);
  Id = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar6 = false;
    if (Id < iVar1) {
      pGVar4 = Gia_ManCo(p,Id);
      vOrder = (Vec_Int_t *)Gia_ObjFanin0(pGVar4);
      bVar6 = vOrder != (Vec_Int_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)vOrder);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjId(p,(Gia_Obj_t *)vOrder);
      iVar3 = Gia_ObjIsLut(p,iVar1);
      if (iVar3 == 0) {
        __assert_fail("Gia_ObjIsLut(p, Id)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaPack.c"
                      ,0x39,"Vec_Int_t *Gia_ManLutCollect2(Gia_Man_t *)");
      }
      iVar3 = Gia_ObjIsTravIdCurrentId(p,iVar1);
      if (iVar3 == 0) {
        Gia_ObjSetTravIdCurrentId(p,iVar1);
        Vec_IntPush(p_00,iVar1);
      }
    }
    Id = Id + 1;
  }
  for (Id = 0; iVar1 = Vec_IntSize(p_00), Id < iVar1; Id = Id + 1) {
    iVar1 = Vec_IntEntry(p_00,Id);
    for (iFan = 0; iVar3 = Gia_ObjLutSize(p,iVar1), iFan < iVar3; iFan = iFan + 1) {
      piVar5 = Gia_ObjLutFanins(p,iVar1);
      iVar3 = piVar5[iFan];
      pGVar4 = Gia_ManObj(p,iVar3);
      iVar2 = Gia_ObjIsAnd(pGVar4);
      if (iVar2 != 0) {
        iVar2 = Gia_ObjIsLut(p,iVar3);
        if (iVar2 == 0) {
          __assert_fail("Gia_ObjIsLut(p, iFan)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaPack.c"
                        ,0x45,"Vec_Int_t *Gia_ManLutCollect2(Gia_Man_t *)");
        }
        iVar2 = Gia_ObjIsTravIdCurrentId(p,iVar3);
        if (iVar2 == 0) {
          Gia_ObjSetTravIdCurrentId(p,iVar3);
          Vec_IntPush(p_00,iVar3);
        }
      }
    }
  }
  iVar1 = Vec_IntCap(p_00);
  if (iVar1 != 0x10) {
    iVar1 = Vec_IntSize(p_00);
    iVar3 = Vec_IntCap(p_00);
    if (iVar1 != iVar3) {
      __assert_fail("Vec_IntCap(vOrder) == 16 || Vec_IntSize(vOrder) == Vec_IntCap(vOrder)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaPack.c"
                    ,0x4c,"Vec_Int_t *Gia_ManLutCollect2(Gia_Man_t *)");
    }
  }
  Vec_IntReverseOrder(p_00);
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collects LUT nodes in the increasing order of distance from COs.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Gia_ManLutCollect2( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vOrder;
    int i, k, Id, iFan;
    vOrder = Vec_IntAlloc( Gia_ManLutNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCoDriver( p, pObj, i )
    {
        if ( !Gia_ObjIsAnd(pObj) )
            continue;
        Id = Gia_ObjId( p, pObj );
        assert( Gia_ObjIsLut(p, Id) );
        if ( Gia_ObjIsTravIdCurrentId(p, Id) )
            continue;
        Gia_ObjSetTravIdCurrentId(p, Id);
        Vec_IntPush( vOrder, Id );
    }
    Vec_IntForEachEntry( vOrder, Id, i )
    {
        Gia_LutForEachFanin( p, Id, iFan, k )
        {
            if ( !Gia_ObjIsAnd(Gia_ManObj(p, iFan)) )
                continue;
            assert( Gia_ObjIsLut(p, iFan) );
            if ( Gia_ObjIsTravIdCurrentId(p, iFan) )
                continue;
            Gia_ObjSetTravIdCurrentId(p, iFan);
            Vec_IntPush( vOrder, iFan );
        }
    }
    assert( Vec_IntCap(vOrder) == 16 || Vec_IntSize(vOrder) == Vec_IntCap(vOrder) );
    Vec_IntReverseOrder( vOrder );
    return vOrder;
}